

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

double __thiscall
soplex::SPxScaler<double>::getRowMinAbsUnscaled(SPxScaler<double> *this,SPxLPBase<double> *lp,int i)

{
  int iVar1;
  DataArray<int> *pDVar2;
  DataArray<int> *pDVar3;
  Nonzero<double> *pNVar4;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  double *pdVar5;
  Item *pIVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  Real RVar11;
  double local_68;
  
  pDVar2 = this->m_activeColscaleExp;
  pDVar3 = this->m_activeRowscaleExp;
  pIVar6 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
           (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
  ::soplex::infinity::__tls_init();
  pdVar5 = (double *)__tls_get_addr(&PTR_003b4b70);
  local_68 = *pdVar5;
  if (0 < (pIVar6->data).super_SVectorBase<double>.memused) {
    iVar1 = pDVar3->data[i];
    lVar7 = 8;
    lVar8 = 0;
    do {
      pNVar4 = (pIVar6->data).super_SVectorBase<double>.m_elem;
      dVar10 = ldexp(*(double *)((long)pNVar4 + lVar7 + -8),
                     -(pDVar2->data[*(int *)((long)&pNVar4->val + lVar7)] + iVar1));
      this_00 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_01 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      RVar11 = Tolerances::epsilon(this_00);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      uVar9 = -(ulong)(ABS(dVar10) - local_68 < -RVar11);
      local_68 = (double)(~uVar9 & (ulong)local_68 | uVar9 & (ulong)ABS(dVar10));
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 < (pIVar6->data).super_SVectorBase<double>.memused);
  }
  return local_68;
}

Assistant:

R SPxScaler<R>::getRowMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R min = R(infinity);

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(LT(abs, min, this->tolerances()->epsilon()))
         min = abs;
   }

   return min;
}